

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Reader.cpp
# Opt level: O3

size_t __thiscall
adios2::core::engine::BP4Reader::UpdateBuffer
          (BP4Reader *this,TimePoint *timeoutInstant,Seconds *pollSeconds)

{
  Comm *this_00;
  BP4Deserializer *pBVar1;
  TransportMan *this_01;
  _func_int **pp_Var2;
  bool bVar3;
  size_t *psVar4;
  size_t sVar5;
  _func_int *p_Var6;
  BP4Deserializer *m_BP4Deserializer;
  BP4Reader *this_02;
  size_type __n;
  ulong size;
  size_t newIdxSize;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b0;
  size_t *local_98;
  size_t expectedMinFileSize;
  vector<char,_std::allocator<char>_> idxbuf;
  string local_70;
  string local_50;
  
  psVar4 = (size_t *)operator_new(0x18);
  local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = psVar4 + 3;
  *psVar4 = 0;
  psVar4[1] = 0;
  psVar4[2] = 0;
  pBVar1 = &this->m_BP4Deserializer;
  local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = psVar4;
  local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (*(int *)((this->m_BP4Deserializer)._vptr_BP4Deserializer[-4] + 0x10 +
              (long)&(this->m_BP4Deserializer)._vptr_BP4Deserializer) == 0) {
    m_BP4Deserializer = (BP4Deserializer *)&this->m_MDIndexFileManager;
    sVar5 = transportman::TransportMan::GetFileSize((TransportMan *)m_BP4Deserializer,0);
    __n = sVar5 - this->m_MDIndexFileAlreadyReadSize;
    if (this->m_MDIndexFileAlreadyReadSize <= sVar5 && __n != 0) {
      std::vector<char,_std::allocator<char>_>::vector(&idxbuf,__n,(allocator_type *)&newIdxSize);
      transportman::TransportMan::ReadFile
                ((TransportMan *)m_BP4Deserializer,
                 idxbuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,__n,this->m_MDIndexFileAlreadyReadSize,0);
      MetadataCalculateMinFileSize
                (m_BP4Deserializer,&(this->super_Engine).m_Name,
                 idxbuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,__n,(bool)(this->m_IdxHeaderParsed ^ 1),
                 this->m_MDFileAlreadyReadSize,&newIdxSize,&expectedMinFileSize);
      p_Var6 = pBVar1->_vptr_BP4Deserializer[-3];
      if ((ulong)(*(long *)(p_Var6 + 0x88 + (long)&(this->m_BP4Deserializer)._vptr_BP4Deserializer)
                 - *(long *)(p_Var6 + 0x80 + (long)&(this->m_BP4Deserializer)._vptr_BP4Deserializer)
                 ) < newIdxSize) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,
                   "re-allocating metadata index buffer, in call to BP4Reader::BeginStep/UpdateBuffer"
                   ,"");
        adios2::format::BufferSTL::Resize
                  ((BufferSTL *)(p_Var6 + 0x38 + (long)&(pBVar1->m_Minifooter).VersionTag),
                   newIdxSize,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
      adios2::format::BufferSTL::Reset
                ((BufferSTL *)
                 (pBVar1->_vptr_BP4Deserializer[-3] + 0x38 +
                 (long)&(pBVar1->m_Minifooter).VersionTag),true,false);
      local_98 = psVar4;
      if (newIdxSize != 0) {
        memmove(*(void **)(pBVar1->_vptr_BP4Deserializer[-3] + 0x80 +
                          (long)&(this->m_BP4Deserializer)._vptr_BP4Deserializer),
                idxbuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start,newIdxSize);
      }
      this_01 = &this->m_MDFileManager;
      do {
        this_02 = (BP4Reader *)this_01;
        sVar5 = transportman::TransportMan::GetFileSize(this_01,0);
        if (expectedMinFileSize <= sVar5) {
          size = expectedMinFileSize - this->m_MDFileAlreadyReadSize;
          p_Var6 = (this->m_BP4Deserializer)._vptr_BP4Deserializer[-4];
          if ((ulong)(*(long *)(p_Var6 + 0xd0 +
                               (long)&(this->m_BP4Deserializer)._vptr_BP4Deserializer) -
                     *(long *)(p_Var6 + 200 + (long)&(this->m_BP4Deserializer)._vptr_BP4Deserializer
                              )) < size) {
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_70,"allocating metadata buffer, in call to BP4Reader Open",
                       "");
            adios2::format::BufferSTL::Resize
                      ((BufferSTL *)(&pBVar1->field_0x88 + (long)p_Var6),size,&local_70);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p);
            }
          }
          adios2::format::BufferSTL::Reset
                    ((BufferSTL *)(&pBVar1->field_0x88 + (long)pBVar1->_vptr_BP4Deserializer[-4]),
                     true,false);
          transportman::TransportMan::ReadFile
                    (this_01,*(char **)((this->m_BP4Deserializer)._vptr_BP4Deserializer[-4] + 200 +
                                       (long)&(this->m_BP4Deserializer)._vptr_BP4Deserializer),size,
                     this->m_MDFileAlreadyReadSize,0);
          sVar5 = this->m_MDFileAlreadyReadSize;
          this->m_MDFileAbsolutePos = sVar5;
          this->m_MDFileAlreadyReadSize = expectedMinFileSize;
          this->m_MDIndexFileAlreadyReadSize = this->m_MDIndexFileAlreadyReadSize + newIdxSize;
          *local_98 = newIdxSize;
          local_98[1] = expectedMinFileSize;
          local_98[2] = sVar5;
          break;
        }
        bVar3 = SleepOrQuit(this_02,timeoutInstant,pollSeconds);
      } while (bVar3);
      if (idxbuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(idxbuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
  }
  this_00 = &(this->super_Engine).m_Comm;
  helper::Comm::BroadcastVector<unsigned_long>(this_00,&local_b0,0);
  sVar5 = *local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (sVar5 != 0) {
    pp_Var2 = pBVar1->_vptr_BP4Deserializer;
    p_Var6 = pp_Var2[-4];
    if (*(int *)(p_Var6 + 0x10 + (long)&(this->m_BP4Deserializer)._vptr_BP4Deserializer) != 0) {
      this->m_MDFileAlreadyReadSize =
           local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[1];
      this->m_MDFileAbsolutePos =
           local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[2];
      adios2::format::BufferSTL::Reset
                ((BufferSTL *)
                 (pp_Var2[-3] + 0x40 + (long)&(this->m_BP4Deserializer)._vptr_BP4Deserializer),true,
                 false);
      adios2::format::BufferSTL::Reset
                ((BufferSTL *)(&pBVar1->field_0x88 + (long)pBVar1->_vptr_BP4Deserializer[-4]),true,
                 false);
      p_Var6 = pBVar1->_vptr_BP4Deserializer[-4];
    }
    helper::Comm::BroadcastVector<char>
              (this_00,(vector<char,_std::allocator<char>_> *)(&pBVar1->field_0xc8 + (long)p_Var6),0
              );
    helper::Comm::BroadcastVector<char>
              (this_00,(vector<char,_std::allocator<char>_> *)
                       (pBVar1->_vptr_BP4Deserializer[-3] + 0x28 +
                       (long)&(pBVar1->m_DeferredVariablesMap)._M_t),0);
    if (local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start == (size_t *)0x0) {
      return sVar5;
    }
  }
  operator_delete(local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start);
  return sVar5;
}

Assistant:

size_t BP4Reader::UpdateBuffer(const TimePoint &timeoutInstant, const Seconds &pollSeconds)
{
    std::vector<size_t> sizes(3, 0);
    if (m_BP4Deserializer.m_RankMPI == 0)
    {
        const size_t idxFileSize = m_MDIndexFileManager.GetFileSize(0);
        if (idxFileSize > m_MDIndexFileAlreadyReadSize)
        {
            const size_t maxIdxSize = idxFileSize - m_MDIndexFileAlreadyReadSize;
            std::vector<char> idxbuf(maxIdxSize);
            m_MDIndexFileManager.ReadFile(idxbuf.data(), maxIdxSize, m_MDIndexFileAlreadyReadSize);
            size_t newIdxSize;
            size_t expectedMinFileSize;
            char *buf = idxbuf.data();

            MetadataCalculateMinFileSize(m_BP4Deserializer, m_Name, buf, maxIdxSize,
                                         !m_IdxHeaderParsed, m_MDFileAlreadyReadSize, newIdxSize,
                                         expectedMinFileSize);

            // const uint64_t expectedMinFileSize = MetadataExpectedMinFileSize(
            //    m_BP4Deserializer, m_Name, !m_IdxHeaderParsed);

            if (m_BP4Deserializer.m_MetadataIndex.m_Buffer.size() < newIdxSize)
            {
                m_BP4Deserializer.m_MetadataIndex.Resize(
                    newIdxSize, "re-allocating metadata index buffer, in "
                                "call to BP4Reader::BeginStep/UpdateBuffer");
            }
            m_BP4Deserializer.m_MetadataIndex.Reset(true, false);
            std::copy(idxbuf.begin(), idxbuf.begin() + newIdxSize,
                      m_BP4Deserializer.m_MetadataIndex.m_Buffer.begin());

            /* Wait until as much metadata arrives in the file as much
             * is indicated by the existing index entries
             */

            size_t fileSize = 0;
            do
            {
                fileSize = m_MDFileManager.GetFileSize(0);
                if (fileSize >= expectedMinFileSize)
                {
                    break;
                }
            } while (SleepOrQuit(timeoutInstant, pollSeconds));

            if (fileSize >= expectedMinFileSize)
            {
                /* Read corresponding new metadata (throwing away the old)
                 * There may be unprocessed entries in the metadata if the index
                 * had less steps than the metadata file at the last read.
                 * Those steps are read again here, starting in the beginning of
                 * the buffer now.
                 */
                const size_t newMDSize = expectedMinFileSize - m_MDFileAlreadyReadSize;
                if (m_BP4Deserializer.m_Metadata.m_Buffer.size() < newMDSize)
                {
                    m_BP4Deserializer.m_Metadata.Resize(newMDSize,
                                                        "allocating metadata buffer, in call to "
                                                        "BP4Reader Open");
                }
                m_BP4Deserializer.m_Metadata.Reset(true, false);
                m_MDFileManager.ReadFile(m_BP4Deserializer.m_Metadata.m_Buffer.data(), newMDSize,
                                         m_MDFileAlreadyReadSize);

                m_MDFileAbsolutePos = m_MDFileAlreadyReadSize;
                m_MDFileAlreadyReadSize = expectedMinFileSize;

                m_MDIndexFileAlreadyReadSize += newIdxSize;

                sizes[0] = newIdxSize;
                sizes[1] = m_MDFileAlreadyReadSize;
                sizes[2] = m_MDFileAbsolutePos;
            }
        }
    }

    m_Comm.BroadcastVector(sizes, 0);
    size_t newIdxSize = sizes[0];

    if (newIdxSize > 0)
    {
        if (m_BP4Deserializer.m_RankMPI != 0)
        {
            m_MDFileAlreadyReadSize = sizes[1];
            m_MDFileAbsolutePos = sizes[2];
            m_BP4Deserializer.m_MetadataIndex.Reset(true, false);
            m_BP4Deserializer.m_Metadata.Reset(true, false);
            // we need this pointer in Metadata buffer on all processes
            // for parsing it correctly in ProcessMetadataForNewSteps()
        }

        // broadcast buffer to all ranks from zero
        m_Comm.BroadcastVector(m_BP4Deserializer.m_Metadata.m_Buffer);

        // broadcast metadata index buffer to all ranks from zero
        m_Comm.BroadcastVector(m_BP4Deserializer.m_MetadataIndex.m_Buffer);
    }
    return newIdxSize;
}